

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O0

void test_general_insertion<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false>>>
               (void)

{
  pointer *pppVar1;
  undefined8 uVar2;
  bool bVar3;
  reference pvVar4;
  lazy_ostream *plVar5;
  basic_cstring<const_char> local_e58;
  basic_cstring<const_char> local_e48;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_e38;
  assertion_result local_e18;
  basic_cstring<const_char> local_e00;
  basic_cstring<const_char> local_df0;
  basic_cstring<const_char> local_de0;
  basic_cstring<const_char> local_dd0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_dc0;
  assertion_result local_da0;
  basic_cstring<const_char> local_d88;
  basic_cstring<const_char> local_d78;
  basic_cstring<const_char> local_d68;
  basic_cstring<const_char> local_d58;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_d48;
  assertion_result local_d28;
  basic_cstring<const_char> local_d10;
  basic_cstring<const_char> local_d00;
  basic_cstring<const_char> local_cf0;
  basic_cstring<const_char> local_ce0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_cd0;
  assertion_result local_cb0;
  basic_cstring<const_char> local_c98;
  basic_cstring<const_char> local_c88;
  basic_cstring<const_char> local_c78;
  basic_cstring<const_char> local_c68;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_c58;
  assertion_result local_c38;
  basic_cstring<const_char> local_c20;
  basic_cstring<const_char> local_c10;
  basic_cstring<const_char> local_c00;
  basic_cstring<const_char> local_bf0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_be0;
  assertion_result local_bc0;
  basic_cstring<const_char> local_ba8;
  basic_cstring<const_char> local_b98;
  basic_cstring<const_char> local_b88;
  basic_cstring<const_char> local_b78;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_b68;
  assertion_result local_b48;
  basic_cstring<const_char> local_b30;
  basic_cstring<const_char> local_b20;
  basic_cstring<const_char> local_b10;
  basic_cstring<const_char> local_b00;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_af0;
  assertion_result local_ad0;
  basic_cstring<const_char> local_ab8;
  basic_cstring<const_char> local_aa8;
  basic_cstring<const_char> local_a98;
  basic_cstring<const_char> local_a88;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_a78;
  assertion_result local_a58;
  basic_cstring<const_char> local_a40;
  basic_cstring<const_char> local_a30;
  basic_cstring<const_char> local_a20;
  basic_cstring<const_char> local_a10;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_a00;
  assertion_result local_9e0;
  basic_cstring<const_char> local_9c8;
  basic_cstring<const_char> local_9b8;
  basic_cstring<const_char> local_9a8;
  basic_cstring<const_char> local_998;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_988;
  assertion_result local_968;
  basic_cstring<const_char> local_950;
  basic_cstring<const_char> local_940;
  basic_cstring<const_char> local_930;
  basic_cstring<const_char> local_920;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_910;
  assertion_result local_8f0;
  basic_cstring<const_char> local_8d8;
  basic_cstring<const_char> local_8c8;
  basic_cstring<const_char> local_8b8;
  basic_cstring<const_char> local_8a8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_898;
  assertion_result local_878;
  basic_cstring<const_char> local_860;
  basic_cstring<const_char> local_850;
  basic_cstring<const_char> local_840;
  basic_cstring<const_char> local_830;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_820;
  assertion_result local_800;
  basic_cstring<const_char> local_7e8;
  basic_cstring<const_char> local_7d8;
  basic_cstring<const_char> local_7c8;
  basic_cstring<const_char> local_7b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_7a8;
  assertion_result local_788;
  basic_cstring<const_char> local_770;
  basic_cstring<const_char> local_760;
  undefined4 local_750;
  Index local_74c;
  basic_cstring<const_char> local_748;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_738;
  basic_cstring<const_char> local_710;
  basic_cstring<const_char> local_700;
  undefined4 local_6f0;
  Index local_6ec;
  basic_cstring<const_char> local_6e8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_6d8;
  basic_cstring<const_char> local_6b0;
  basic_cstring<const_char> local_6a0;
  undefined4 local_690;
  Index local_68c;
  basic_cstring<const_char> local_688;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_678;
  basic_cstring<const_char> local_650;
  basic_cstring<const_char> local_640;
  basic_cstring<const_char> local_630;
  basic_cstring<const_char> local_620;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_610;
  assertion_result local_5f0;
  basic_cstring<const_char> local_5d8;
  basic_cstring<const_char> local_5c8;
  basic_cstring<const_char> local_5b8;
  basic_cstring<const_char> local_5a8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_598;
  assertion_result local_578;
  basic_cstring<const_char> local_560;
  basic_cstring<const_char> local_550;
  basic_cstring<const_char> local_540;
  basic_cstring<const_char> local_530;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_520;
  assertion_result local_500;
  basic_cstring<const_char> local_4e8;
  basic_cstring<const_char> local_4d8;
  basic_cstring<const_char> local_4c8;
  basic_cstring<const_char> local_4b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_4a8;
  assertion_result local_488;
  basic_cstring<const_char> local_470;
  basic_cstring<const_char> local_460;
  basic_cstring<const_char> local_450;
  basic_cstring<const_char> local_440;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_430;
  assertion_result local_410;
  basic_cstring<const_char> local_3f8;
  basic_cstring<const_char> local_3e8;
  basic_cstring<const_char> local_3d8;
  basic_cstring<const_char> local_3c8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_3b8;
  assertion_result local_398;
  basic_cstring<const_char> local_380;
  basic_cstring<const_char> local_370;
  basic_cstring<const_char> local_360;
  basic_cstring<const_char> local_350;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_340;
  assertion_result local_320;
  basic_cstring<const_char> local_308;
  basic_cstring<const_char> local_2f8;
  basic_cstring<const_char> local_2e8;
  basic_cstring<const_char> local_2d8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_2c8;
  assertion_result local_2a8;
  basic_cstring<const_char> local_290;
  basic_cstring<const_char> local_280;
  basic_cstring<const_char> local_270;
  basic_cstring<const_char> local_260;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_250;
  assertion_result local_230;
  basic_cstring<const_char> local_218;
  basic_cstring<const_char> local_208;
  basic_cstring<const_char> local_1f8;
  basic_cstring<const_char> local_1e8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1d8;
  assertion_result local_1b8;
  basic_cstring<const_char> local_1a0;
  basic_cstring<const_char> local_190;
  basic_cstring<const_char> local_180;
  basic_cstring<const_char> local_170;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_160;
  assertion_result local_140;
  basic_cstring<const_char> local_128;
  basic_cstring<const_char> local_118;
  basic_cstring<const_char> local_108;
  basic_cstring<const_char> local_f8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_e8;
  assertion_result local_c8;
  basic_cstring<const_char> local_b0;
  basic_cstring<const_char> local_a0;
  undefined1 local_90 [8];
  Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_> m;
  value_type col1;
  undefined1 local_38 [8];
  value_type col2;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  columns;
  
  build_general_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false>>>>
            ();
  pvVar4 = std::
           vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           ::back((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                   *)&col2.
                      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)local_38,pvVar4);
  pppVar1 = &col2.
             super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::pop_back((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)pppVar1);
  pvVar4 = std::
           vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           ::back((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                   *)pppVar1);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)&m.matrix_.colSettings_,pvVar4);
  pppVar1 = &col2.
             super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::pop_back((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)pppVar1);
  Gudhi::persistence_matrix::
  Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false>>::
  Matrix<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false>> *)
             local_90,(vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                       *)pppVar1,5);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_b0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_a0,0x18e,&local_b0);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>::
            is_zero_entry((Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>
                           *)local_90,1,0);
    boost::test_tools::assertion_result::assertion_result(&local_c8,bVar3);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f8,"m.is_zero_entry(1, 0)",0x15);
    boost::unit_test::operator<<(&local_e8,plVar5,&local_f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_108,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_c8,&local_e8,&local_108,0x18e,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_e8);
    boost::test_tools::assertion_result::~assertion_result(&local_c8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_118,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_128);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_118,399,&local_128);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>::
            is_zero_entry((Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>
                           *)local_90,3,0);
    boost::test_tools::assertion_result::assertion_result(&local_140,(bool)(~bVar3 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_170,"!m.is_zero_entry(3, 0)",0x16);
    boost::unit_test::operator<<(&local_160,plVar5,&local_170);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_180,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_140,&local_160,&local_180,399,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_160);
    boost::test_tools::assertion_result::~assertion_result(&local_140);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_190,400,&local_1a0);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>::
            is_zero_column((Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>
                            *)local_90,0);
    boost::test_tools::assertion_result::assertion_result(&local_1b8,bVar3);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1e8,"m.is_zero_column(0)",0x13);
    boost::unit_test::operator<<(&local_1d8,plVar5,&local_1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_1b8,&local_1d8,&local_1f8,400,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1d8);
    boost::test_tools::assertion_result::~assertion_result(&local_1b8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_218);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_208,0x191,&local_218);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>::
            is_zero_column((Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>
                            *)local_90,1);
    boost::test_tools::assertion_result::assertion_result(&local_230,bVar3);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_260,"m.is_zero_column(1)",0x13);
    boost::unit_test::operator<<(&local_250,plVar5,&local_260);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_230,&local_250,&local_270,0x191,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_250);
    boost::test_tools::assertion_result::~assertion_result(&local_230);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_280,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_290);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_280,0x192,&local_290);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>::
            is_zero_column((Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>
                            *)local_90,2);
    boost::test_tools::assertion_result::assertion_result(&local_2a8,bVar3);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2d8,"m.is_zero_column(2)",0x13);
    boost::unit_test::operator<<(&local_2c8,plVar5,&local_2d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2e8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_2a8,&local_2c8,&local_2e8,0x192,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_2c8);
    boost::test_tools::assertion_result::~assertion_result(&local_2a8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2f8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_308);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_2f8,0x193,&local_308);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>::
            is_zero_column((Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>
                            *)local_90,3);
    boost::test_tools::assertion_result::assertion_result(&local_320,(bool)(~bVar3 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_350,"!m.is_zero_column(3)",0x14);
    boost::unit_test::operator<<(&local_340,plVar5,&local_350);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_360,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_320,&local_340,&local_360,0x193,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_340);
    boost::test_tools::assertion_result::~assertion_result(&local_320);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_370,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_380);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_370,0x194,&local_380);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>::
            is_zero_column((Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>
                            *)local_90,4);
    boost::test_tools::assertion_result::assertion_result(&local_398,bVar3);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3c8,"m.is_zero_column(4)",0x13);
    boost::unit_test::operator<<(&local_3b8,plVar5,&local_3c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_398,&local_3b8,&local_3d8,0x194,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_3b8);
    boost::test_tools::assertion_result::~assertion_result(&local_398);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3e8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3f8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_3e8,0x195,&local_3f8);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>::
            is_zero_column((Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>
                            *)local_90,5);
    boost::test_tools::assertion_result::assertion_result(&local_410,(bool)(~bVar3 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_440,"!m.is_zero_column(5)",0x14);
    boost::unit_test::operator<<(&local_430,plVar5,&local_440);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_450,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_410,&local_430,&local_450,0x195,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_430);
    boost::test_tools::assertion_result::~assertion_result(&local_410);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_460,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_470);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_460,0x196,&local_470);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>::
            is_zero_column((Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>
                            *)local_90,6);
    boost::test_tools::assertion_result::assertion_result(&local_488,(bool)(~bVar3 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4b8,"!m.is_zero_column(6)",0x14);
    boost::unit_test::operator<<(&local_4a8,plVar5,&local_4b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4c8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_488,&local_4a8,&local_4c8,0x196,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_4a8);
    boost::test_tools::assertion_result::~assertion_result(&local_488);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_4e8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_4d8,0x197,&local_4e8);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>::
            is_zero_column((Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>
                            *)local_90,7);
    boost::test_tools::assertion_result::assertion_result(&local_500,(bool)(~bVar3 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_530,"!m.is_zero_column(7)",0x14);
    boost::unit_test::operator<<(&local_520,plVar5,&local_530);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_540,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_500,&local_520,&local_540,0x197,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_520);
    boost::test_tools::assertion_result::~assertion_result(&local_500);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_550,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_560);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_550,0x198,&local_560);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>::
            is_zero_column((Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>
                            *)local_90,8);
    boost::test_tools::assertion_result::assertion_result(&local_578,(bool)(~bVar3 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5a8,"!m.is_zero_column(8)",0x14);
    boost::unit_test::operator<<(&local_598,plVar5,&local_5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5b8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_578,&local_598,&local_5b8,0x198,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_598);
    boost::test_tools::assertion_result::~assertion_result(&local_578);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5c8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_5d8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_5c8,0x199,&local_5d8);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>::
            is_zero_column((Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>
                            *)local_90,9);
    boost::test_tools::assertion_result::assertion_result(&local_5f0,(bool)(~bVar3 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_620,"!m.is_zero_column(9)",0x14);
    boost::unit_test::operator<<(&local_610,plVar5,&local_620);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_630,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_5f0,&local_610,&local_630,0x199,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_610);
    boost::test_tools::assertion_result::~assertion_result(&local_5f0);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_640,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_650);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_640,0x19a,&local_650);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_678,plVar5,(char (*) [1])0x2301d0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_688,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_68c = Gudhi::persistence_matrix::
                Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>
                ::get_number_of_columns
                          ((Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>
                            *)local_90);
    local_690 = 10;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_678,&local_688,0x19a,1,2,&local_68c,"m.get_number_of_columns()",&local_690,
               "10");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_678);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  Gudhi::persistence_matrix::
  Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false>>::
  insert_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false>> *)
             local_90,(vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       *)&m.matrix_.colSettings_);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6a0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_6b0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_6a0,0x19c,&local_6b0);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_6d8,plVar5,(char (*) [1])0x2301d0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6e8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_6ec = Gudhi::persistence_matrix::
                Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>
                ::get_number_of_columns
                          ((Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>
                            *)local_90);
    local_6f0 = 0xb;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_6d8,&local_6e8,0x19c,1,2,&local_6ec,"m.get_number_of_columns()",&local_6f0,
               "11");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_6d8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  Gudhi::persistence_matrix::
  Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false>>::
  insert_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false>> *)
             local_90,(vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       *)local_38);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_700,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_710);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_700,0x19e,&local_710);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_738,plVar5,(char (*) [1])0x2301d0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_748,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_74c = Gudhi::persistence_matrix::
                Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>
                ::get_number_of_columns
                          ((Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>
                            *)local_90);
    local_750 = 0xc;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_738,&local_748,0x19e,1,2,&local_74c,"m.get_number_of_columns()",&local_750,
               "12");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_738);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_760,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_770);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_760,0x19f,&local_770);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>::
            is_zero_entry((Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>
                           *)local_90,1,0);
    boost::test_tools::assertion_result::assertion_result(&local_788,bVar3);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7b8,"m.is_zero_entry(1, 0)",0x15);
    boost::unit_test::operator<<(&local_7a8,plVar5,&local_7b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7c8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_788,&local_7a8,&local_7c8,0x19f,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_7a8);
    boost::test_tools::assertion_result::~assertion_result(&local_788);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_7e8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_7d8,0x1a0,&local_7e8);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>::
            is_zero_entry((Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>
                           *)local_90,3,0);
    boost::test_tools::assertion_result::assertion_result(&local_800,(bool)(~bVar3 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_830,"!m.is_zero_entry(3, 0)",0x16);
    boost::unit_test::operator<<(&local_820,plVar5,&local_830);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_840,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_800,&local_820,&local_840,0x1a0,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_820);
    boost::test_tools::assertion_result::~assertion_result(&local_800);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_850,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_860);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_850,0x1a1,&local_860);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>::
            is_zero_column((Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>
                            *)local_90,0);
    boost::test_tools::assertion_result::assertion_result(&local_878,bVar3);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8a8,"m.is_zero_column(0)",0x13);
    boost::unit_test::operator<<(&local_898,plVar5,&local_8a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8b8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_878,&local_898,&local_8b8,0x1a1,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_898);
    boost::test_tools::assertion_result::~assertion_result(&local_878);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8c8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_8d8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_8c8,0x1a2,&local_8d8);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>::
            is_zero_column((Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>
                            *)local_90,1);
    boost::test_tools::assertion_result::assertion_result(&local_8f0,bVar3);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_920,"m.is_zero_column(1)",0x13);
    boost::unit_test::operator<<(&local_910,plVar5,&local_920);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_930,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_8f0,&local_910,&local_930,0x1a2,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_910);
    boost::test_tools::assertion_result::~assertion_result(&local_8f0);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_940,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_950);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_940,0x1a3,&local_950);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>::
            is_zero_column((Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>
                            *)local_90,2);
    boost::test_tools::assertion_result::assertion_result(&local_968,bVar3);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_998,"m.is_zero_column(2)",0x13);
    boost::unit_test::operator<<(&local_988,plVar5,&local_998);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9a8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_968,&local_988,&local_9a8,0x1a3,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_988);
    boost::test_tools::assertion_result::~assertion_result(&local_968);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9b8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_9c8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_9b8,0x1a4,&local_9c8);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>::
            is_zero_column((Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>
                            *)local_90,3);
    boost::test_tools::assertion_result::assertion_result(&local_9e0,(bool)(~bVar3 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a10,"!m.is_zero_column(3)",0x14);
    boost::unit_test::operator<<(&local_a00,plVar5,&local_a10);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a20,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_9e0,&local_a00,&local_a20,0x1a4,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_a00);
    boost::test_tools::assertion_result::~assertion_result(&local_9e0);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a30,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_a40);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_a30,0x1a5,&local_a40);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>::
            is_zero_column((Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>
                            *)local_90,4);
    boost::test_tools::assertion_result::assertion_result(&local_a58,bVar3);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a88,"m.is_zero_column(4)",0x13);
    boost::unit_test::operator<<(&local_a78,plVar5,&local_a88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a98,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_a58,&local_a78,&local_a98,0x1a5,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_a78);
    boost::test_tools::assertion_result::~assertion_result(&local_a58);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_aa8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_ab8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_aa8,0x1a6,&local_ab8);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>::
            is_zero_column((Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>
                            *)local_90,5);
    boost::test_tools::assertion_result::assertion_result(&local_ad0,(bool)(~bVar3 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b00,"!m.is_zero_column(5)",0x14);
    boost::unit_test::operator<<(&local_af0,plVar5,&local_b00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b10,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_ad0,&local_af0,&local_b10,0x1a6,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_af0);
    boost::test_tools::assertion_result::~assertion_result(&local_ad0);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b20,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_b30);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_b20,0x1a7,&local_b30);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>::
            is_zero_column((Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>
                            *)local_90,6);
    boost::test_tools::assertion_result::assertion_result(&local_b48,(bool)(~bVar3 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b78,"!m.is_zero_column(6)",0x14);
    boost::unit_test::operator<<(&local_b68,plVar5,&local_b78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b88,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_b48,&local_b68,&local_b88,0x1a7,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_b68);
    boost::test_tools::assertion_result::~assertion_result(&local_b48);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b98,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_ba8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_b98,0x1a8,&local_ba8);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>::
            is_zero_column((Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>
                            *)local_90,7);
    boost::test_tools::assertion_result::assertion_result(&local_bc0,(bool)(~bVar3 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_bf0,"!m.is_zero_column(7)",0x14);
    boost::unit_test::operator<<(&local_be0,plVar5,&local_bf0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c00,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_bc0,&local_be0,&local_c00,0x1a8,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_be0);
    boost::test_tools::assertion_result::~assertion_result(&local_bc0);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c10,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_c20);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_c10,0x1a9,&local_c20);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>::
            is_zero_column((Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>
                            *)local_90,8);
    boost::test_tools::assertion_result::assertion_result(&local_c38,(bool)(~bVar3 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c68,"!m.is_zero_column(8)",0x14);
    boost::unit_test::operator<<(&local_c58,plVar5,&local_c68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c78,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_c38,&local_c58,&local_c78,0x1a9,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_c58);
    boost::test_tools::assertion_result::~assertion_result(&local_c38);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c88,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_c98);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_c88,0x1aa,&local_c98);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>::
            is_zero_column((Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>
                            *)local_90,9);
    boost::test_tools::assertion_result::assertion_result(&local_cb0,(bool)(~bVar3 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ce0,"!m.is_zero_column(9)",0x14);
    boost::unit_test::operator<<(&local_cd0,plVar5,&local_ce0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_cf0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_cb0,&local_cd0,&local_cf0,0x1aa,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_cd0);
    boost::test_tools::assertion_result::~assertion_result(&local_cb0);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d00,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_d10);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_d00,0x1ab,&local_d10);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>::
            is_zero_column((Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>
                            *)local_90,10);
    boost::test_tools::assertion_result::assertion_result(&local_d28,(bool)(~bVar3 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d58,"!m.is_zero_column(10)",0x15);
    boost::unit_test::operator<<(&local_d48,plVar5,&local_d58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d68,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_d28,&local_d48,&local_d68,0x1ab,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_d48);
    boost::test_tools::assertion_result::~assertion_result(&local_d28);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d78,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_d88);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_d78,0x1ac,&local_d88);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>::
            is_zero_column((Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>
                            *)local_90,0xb);
    boost::test_tools::assertion_result::assertion_result(&local_da0,(bool)(~bVar3 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_dd0,"!m.is_zero_column(11)",0x15);
    boost::unit_test::operator<<(&local_dc0,plVar5,&local_dd0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_de0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_da0,&local_dc0,&local_de0,0x1ac,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_dc0);
    boost::test_tools::assertion_result::~assertion_result(&local_da0);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_df0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_e00);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_df0,0x1ad,&local_e00);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>::
            is_zero_entry((Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>
                           *)local_90,3,1);
    boost::test_tools::assertion_result::assertion_result(&local_e18,(bool)(~bVar3 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e48,"!m.is_zero_entry(3, 1)",0x16);
    boost::unit_test::operator<<(&local_e38,plVar5,&local_e48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e58,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_e18,&local_e38,&local_e58,0x1ad,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_e38);
    boost::test_tools::assertion_result::~assertion_result(&local_e18);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  Gudhi::persistence_matrix::
  Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>::~Matrix
            ((Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>
              *)local_90);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             *)&m.matrix_.colSettings_);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             *)local_38);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)&col2.
                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void test_general_insertion() {
  auto columns = build_general_matrix<typename Matrix::Column>();
  auto col2 = columns.back();
  columns.pop_back();
  auto col1 = columns.back();
  columns.pop_back();

  Matrix m(columns, 5);
  BOOST_CHECK(m.is_zero_entry(1, 0));
  BOOST_CHECK(!m.is_zero_entry(3, 0));
  BOOST_CHECK(m.is_zero_column(0));
  BOOST_CHECK(m.is_zero_column(1));
  BOOST_CHECK(m.is_zero_column(2));
  BOOST_CHECK(!m.is_zero_column(3));
  BOOST_CHECK(m.is_zero_column(4));
  BOOST_CHECK(!m.is_zero_column(5));
  BOOST_CHECK(!m.is_zero_column(6));
  BOOST_CHECK(!m.is_zero_column(7));
  BOOST_CHECK(!m.is_zero_column(8));
  BOOST_CHECK(!m.is_zero_column(9));
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 10);
  m.insert_column(col1);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 11);
  m.insert_column(col2);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 12);
  BOOST_CHECK(m.is_zero_entry(1, 0));
  BOOST_CHECK(!m.is_zero_entry(3, 0));
  BOOST_CHECK(m.is_zero_column(0));
  BOOST_CHECK(m.is_zero_column(1));
  BOOST_CHECK(m.is_zero_column(2));
  BOOST_CHECK(!m.is_zero_column(3));
  BOOST_CHECK(m.is_zero_column(4));
  BOOST_CHECK(!m.is_zero_column(5));
  BOOST_CHECK(!m.is_zero_column(6));
  BOOST_CHECK(!m.is_zero_column(7));
  BOOST_CHECK(!m.is_zero_column(8));
  BOOST_CHECK(!m.is_zero_column(9));
  BOOST_CHECK(!m.is_zero_column(10));
  BOOST_CHECK(!m.is_zero_column(11));
  BOOST_CHECK(!m.is_zero_entry(3, 1));
}